

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  byte bVar1;
  U16 UVar2;
  BYTE *pBVar3;
  size_t sVar4;
  BYTE *__n;
  BYTE *__src;
  BYTE *pBVar5;
  int originalSize_local;
  char *dest_local;
  char *source_local;
  size_t u;
  size_t extml;
  BYTE *extMatch;
  BYTE *dictEnd;
  BYTE *match;
  size_t offset;
  size_t ml;
  size_t ll;
  uint token;
  BYTE *prefixStart;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  long local_38;
  undefined8 local_30;
  int local_24;
  char *local_20;
  char *local_18;
  
  local_30 = 0;
  local_38 = 0;
  ip = (BYTE *)0x0;
  pBVar3 = (BYTE *)(dest + originalSize);
  oend = (BYTE *)dest;
  op = (BYTE *)source;
  local_24 = originalSize;
  local_20 = dest;
  local_18 = source;
  while( true ) {
    pBVar5 = op + 1;
    bVar1 = *op;
    ml = (size_t)(bVar1 >> 4);
    op = pBVar5;
    if (ml == 0xf) {
      sVar4 = read_long_length_no_check(&op);
      ml = sVar4 + 0xf;
    }
    if ((ulong)((long)pBVar3 - (long)oend) < ml) {
      return -1;
    }
    memmove(oend,op,ml);
    oend = oend + ml;
    op = op + ml;
    if ((ulong)((long)pBVar3 - (long)oend) < 0xc) {
      if (oend == pBVar3) {
        return (int)op - (int)local_18;
      }
      return -1;
    }
    offset = (size_t)(bVar1 & 0xf);
    UVar2 = LZ4_readLE16(op);
    pBVar5 = (BYTE *)(ulong)UVar2;
    op = op + 2;
    if (offset == 0xf) {
      sVar4 = read_long_length_no_check(&op);
      offset = sVar4 + 0xf;
    }
    __n = (BYTE *)(offset + 4);
    if (pBVar3 + -(long)oend < __n) break;
    dictEnd = oend + -(long)pBVar5;
    if (ip + ((long)oend - (long)dest) < pBVar5) {
      return -1;
    }
    offset = (size_t)__n;
    if (oend + -(long)dest < pBVar5) {
      __src = ip + (local_38 - ((long)pBVar5 - ((long)oend - (long)dest)));
      pBVar5 = ip + (local_38 - (long)__src);
      if (__n < pBVar5) {
        memmove(oend,__src,(size_t)__n);
        offset = 0;
        pBVar5 = __n;
      }
      else {
        memmove(oend,__src,(size_t)pBVar5);
        offset = (long)__n - (long)pBVar5;
      }
      oend = oend + (long)pBVar5;
      dictEnd = (BYTE *)dest;
    }
    for (source_local = (char *)0x0; source_local < offset; source_local = source_local + 1) {
      oend[(long)source_local] = dictEnd[(long)source_local];
    }
    oend = oend + offset;
    if ((ulong)((long)pBVar3 - (long)oend) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    DEBUGLOG(5, "LZ4_decompress_fast");
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, NULL, 0);
}